

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O3

void __thiscall
QCryptographicHashPrivate::State::finalizeUnchecked(State *this,Algorithm method,HashResult *result)

{
  uchar *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [12];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  uint uVar34;
  Sha3Variant sha3Variant;
  int iVar35;
  uint uVar36;
  SHA3Context *pSVar37;
  uchar *__s;
  long lVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  long in_FS_OFFSET;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint8_t buffer [64];
  SHA3Context local_228;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(method) {
  case Md4:
    memcpy(&local_228,this,0x98);
    uVar39 = (ulong)(local_228.state._0_4_ & 0x3f);
    puVar1 = local_228.state + 0x18;
    lVar38 = uVar39 + 1;
    local_228.state[uVar39 + 0x18] = 0x80;
    uVar39 = uVar39 ^ 0x3f;
    if (uVar39 < 8) {
      memset(puVar1 + lVar38,0,uVar39);
      uVar39 = 0x40;
      body((md4_context *)&local_228,puVar1,0x40);
      lVar38 = 0;
    }
    memset(puVar1 + lVar38,0,uVar39 - 8);
    local_228.state[0x51] = (uchar)((uint)local_228.state._0_4_ >> 5);
    local_228.state[0x50] = (uchar)(local_228.state._0_4_ * 8);
    local_228.state[0x52] = (uchar)((uint)local_228.state._0_4_ >> 0xd);
    local_228.state[0x53] = (uchar)((uint)local_228.state._0_4_ >> 0x15);
    local_228.state[0x54] = local_228.state[4];
    local_228.state[0x55] = local_228.state[5];
    local_228.state[0x56] = local_228.state[6];
    local_228.state[0x57] = local_228.state[7];
    local_228.state._0_4_ = local_228.state._0_4_ * 8;
    body((md4_context *)&local_228,puVar1,0x40);
    *(undefined4 *)(result->m_data)._M_elems = local_228.state._8_4_;
    *(undefined4 *)((result->m_data)._M_elems + 4) = local_228.state._12_4_;
    *(undefined4 *)((result->m_data)._M_elems + 8) = local_228.state._16_4_;
    *(undefined4 *)((result->m_data)._M_elems + 0xc) = local_228.state._20_4_;
    break;
  case Md5:
    pSVar37 = &local_228;
    for (lVar38 = 0x16; lVar38 != 0; lVar38 = lVar38 + -1) {
      *(undefined4 *)pSVar37 = *(undefined4 *)this;
      this = this + 4;
      pSVar37 = (SHA3Context *)((long)pSVar37 + 4);
    }
    uVar36 = local_228.state._16_4_ & 0x3f;
    puVar1 = local_228.state + 0x18;
    local_228.state[(ulong)uVar36 + 0x18] = 0x80;
    uVar34 = 0x37 - uVar36;
    __s = local_228.state + (ulong)uVar36 + 0x19;
    if (0x37 < uVar36) {
      memset(local_228.state + (ulong)uVar36 + 0x19,0,(ulong)(uVar36 ^ 0x3f));
      MD5Transform((UWORD32 *)&local_228,(UWORD32 *)puVar1);
      uVar34 = 0x38;
      __s = puVar1;
    }
    memset(__s,0,(ulong)uVar34);
    local_228.state._84_4_ = local_228.state._20_4_ << 3 | (uint)local_228.state._16_4_ >> 0x1d;
    local_228.state._80_4_ = local_228.state._16_4_ * 8;
    MD5Transform((UWORD32 *)&local_228,(UWORD32 *)puVar1);
    *(ulong *)(result->m_data)._M_elems = CONCAT44(local_228.state._4_4_,local_228.state._0_4_);
    *(ulong *)((result->m_data)._M_elems + 8) =
         CONCAT44(local_228.state._12_4_,local_228.state._8_4_);
    break;
  case Sha1:
    pSVar37 = &local_228;
    for (lVar38 = 0xc; lVar38 != 0; lVar38 = lVar38 + -1) {
      *(undefined8 *)pSVar37 = *(undefined8 *)this;
      this = this + 8;
      pSVar37 = (SHA3Context *)((long)pSVar37 + 8);
    }
    uVar39 = local_228.state._24_8_ * 8;
    local_80 = uVar39 >> 0x38 | (uVar39 & 0xff000000000000) >> 0x28 |
               (uVar39 & 0xff0000000000) >> 0x18 | (uVar39 & 0xff00000000) >> 8 |
               (uVar39 & 0xff000000) << 8 | (uVar39 & 0xff0000) << 0x18 | (uVar39 & 0xff00) << 0x28
               | local_228.state._24_8_ << 0x3b;
    uVar34 = local_228.state._24_4_;
    uVar39 = (ulong)(uVar34 & 0x3f);
    local_228.state._24_8_ = local_228.state._24_8_ + 1;
    puVar1 = local_228.state + 0x20;
    if (uVar39 == 0x3f) {
      local_228.state[0x5f] = 0x80;
      sha1ProcessChunk((Sha1State *)&local_228,puVar1);
    }
    else {
      local_228.state[uVar39 + 0x20] = 0x80;
    }
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    uVar34 = uVar34 & 0x3f;
    uVar39 = (ulong)((uint)local_228.state._24_8_ & 0x3f);
    if (uVar34 < 0x38) {
      uVar41 = (ulong)(0x37 - uVar34);
      local_228.state._24_8_ = local_228.state._24_8_ + uVar41;
      if (0x3f < uVar39 + uVar41) {
        sVar40 = -uVar39 + 0x40;
        memcpy(puVar1 + uVar39,local_78,sVar40);
        sha1ProcessChunk((Sha1State *)&local_228,puVar1);
        if ((long)sVar40 < (long)(uVar41 - ((uint)(uVar39 + uVar41) & 0x3f))) {
          sha1ProcessChunk((Sha1State *)&local_228,(uchar *)((long)&local_38 + -uVar39));
          sVar40 = 0x80 - uVar39;
        }
        lVar38 = uVar41 - sVar40;
        goto LAB_003567b2;
      }
      memcpy(puVar1 + uVar39,local_78,uVar41);
    }
    else {
      uVar41 = (ulong)(uVar34 ^ 0x3f);
      local_228.state._24_8_ = local_228.state._24_8_ + uVar41;
      if (uVar39 + uVar41 < 0x40) {
        memcpy(puVar1 + uVar39,local_78,uVar41);
      }
      else {
        sVar40 = -uVar39 + 0x40;
        memcpy(puVar1 + uVar39,local_78,sVar40);
        sha1ProcessChunk((Sha1State *)&local_228,puVar1);
        if ((long)sVar40 < (long)(uVar41 - ((uint)(uVar39 + uVar41) & 0x3f))) {
          sVar40 = 0x80 - uVar39;
          sha1ProcessChunk((Sha1State *)&local_228,(uchar *)((long)&local_38 + -uVar39));
        }
        __memcpy_chk(puVar1,local_78 + sVar40,uVar41 - sVar40,0x40);
      }
      uVar39 = (ulong)(local_228.state._24_4_ & 0x3f);
      lVar38 = local_228.state._24_8_ + 0x38;
      local_228.state._24_8_ = lVar38;
      if (uVar39 < 8) {
        *(undefined8 *)(local_228.state + uVar39 + 0x50) = local_48._0_8_;
        uVar29 = local_78._0_8_;
        uVar30 = local_78._8_8_;
        uVar31 = local_68._0_8_;
        uVar32 = local_68._8_8_;
        uVar33 = local_58._8_8_;
        *(undefined8 *)(local_228.state + uVar39 + 0x40) = local_58._0_8_;
        *(undefined8 *)(local_228.state + uVar39 + 0x48) = uVar33;
        *(undefined8 *)(local_228.state + uVar39 + 0x30) = uVar31;
        *(undefined8 *)(local_228.state + uVar39 + 0x38) = uVar32;
        *(undefined8 *)(puVar1 + uVar39) = uVar29;
        *(undefined8 *)(local_228.state + uVar39 + 0x28) = uVar30;
      }
      else {
        sVar40 = -uVar39 + 0x40;
        memcpy(puVar1 + uVar39,local_78,sVar40);
        sha1ProcessChunk((Sha1State *)&local_228,puVar1);
        if ((long)sVar40 < (long)(0x38 - (ulong)((uint)lVar38 & 0x3f))) {
          sVar40 = 0x80 - uVar39;
          sha1ProcessChunk((Sha1State *)&local_228,(uchar *)((long)&local_38 + -uVar39));
        }
        lVar38 = 0x38 - sVar40;
LAB_003567b2:
        __memcpy_chk(puVar1,local_78 + sVar40,lVar38,0x40);
      }
    }
    uVar39 = (ulong)(local_228.state._24_4_ & 0x3f);
    lVar38 = local_228.state._24_8_ + 8;
    local_228.state._24_8_ = lVar38;
    if (uVar39 < 0x38) {
      *(ulong *)(local_228.state + uVar39 + 0x20) = local_80;
    }
    else {
      uVar41 = -uVar39 + 0x40;
      memcpy(puVar1 + uVar39,&local_80,uVar41);
      sha1ProcessChunk((Sha1State *)&local_228,puVar1);
      if (uVar41 < 8 - (ulong)((uint)lVar38 & 0x3f)) {
        sha1ProcessChunk((Sha1State *)&local_228,local_48 + -uVar39 + 8);
        uVar41 = 0x80 - uVar39;
      }
      __memcpy_chk(puVar1,local_78 + (uVar41 - 8),8 - uVar41,0x40);
    }
    auVar25[8] = local_228.state[8];
    auVar25[9] = local_228.state[9];
    auVar25[10] = local_228.state[10];
    auVar25[0xb] = local_228.state[0xb];
    auVar25._0_8_ = CONCAT44(local_228.state._4_4_,local_228.state._0_4_);
    auVar43[0xc] = local_228.state[0xc];
    auVar43[0xd] = local_228.state[0xd];
    auVar43[0xe] = local_228.state[0xe];
    auVar43[0xf] = local_228.state[0xf];
    auVar43._0_12_ = auVar25;
    auVar45[1] = 0;
    auVar45[0] = local_228.state[8];
    auVar45[2] = local_228.state[9];
    auVar45[3] = 0;
    auVar45[4] = local_228.state[10];
    auVar45[5] = 0;
    auVar45[6] = local_228.state[0xb];
    auVar45[7] = 0;
    auVar45[8] = local_228.state[0xc];
    auVar45[9] = 0;
    auVar45[10] = local_228.state[0xd];
    auVar45[0xb] = 0;
    auVar45[0xc] = local_228.state[0xe];
    auVar45[0xd] = 0;
    auVar45[0xe] = local_228.state[0xf];
    auVar45[0xf] = 0;
    auVar44 = pshuflw(auVar45,auVar45,0x1b);
    auVar45 = pshufhw(auVar44,auVar44,0x1b);
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar43._0_13_;
    auVar18[0xe] = local_228.state[7];
    auVar19[0xc] = local_228.state[6];
    auVar19._0_12_ = auVar25;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar25._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    auVar21[10] = local_228.state[5];
    auVar21._0_10_ = auVar25._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar25._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    auVar23[8] = local_228.state[4];
    auVar23._0_8_ = CONCAT44(local_228.state._4_4_,local_228.state._0_4_);
    auVar23._9_6_ = auVar22._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar23._8_7_;
    auVar27._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar27[0] = local_228.state[3];
    auVar27._9_6_ = 0;
    auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar28[0] = local_228.state[2];
    auVar28._11_4_ = 0;
    auVar24[2] = local_228.state[1];
    auVar24._0_2_ = local_228.state._0_2_;
    auVar24._3_12_ = SUB1512(auVar28 << 0x20,3);
    auVar44._0_2_ = local_228.state._0_2_ & 0xff;
    auVar44._2_13_ = auVar24._2_13_;
    auVar44[0xf] = 0;
    auVar43 = pshuflw((undefined1  [16])0x0,auVar44,0x1b);
    auVar43 = pshufhw(auVar43,auVar43,0x1b);
    sVar2 = auVar43._0_2_;
    sVar3 = auVar43._2_2_;
    sVar4 = auVar43._4_2_;
    sVar5 = auVar43._6_2_;
    sVar6 = auVar43._8_2_;
    sVar7 = auVar43._10_2_;
    sVar8 = auVar43._12_2_;
    sVar9 = auVar43._14_2_;
    sVar10 = auVar45._0_2_;
    sVar11 = auVar45._2_2_;
    sVar12 = auVar45._4_2_;
    sVar13 = auVar45._6_2_;
    sVar14 = auVar45._8_2_;
    sVar15 = auVar45._10_2_;
    sVar16 = auVar45._12_2_;
    sVar17 = auVar45._14_2_;
    (result->m_data)._M_elems[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar43[0] - (0xff < sVar2);
    (result->m_data)._M_elems[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar43[2] - (0xff < sVar3);
    (result->m_data)._M_elems[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar43[4] - (0xff < sVar4);
    (result->m_data)._M_elems[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar43[6] - (0xff < sVar5);
    (result->m_data)._M_elems[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar43[8] - (0xff < sVar6);
    (result->m_data)._M_elems[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar43[10] - (0xff < sVar7);
    (result->m_data)._M_elems[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar43[0xc] - (0xff < sVar8);
    (result->m_data)._M_elems[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar43[0xe] - (0xff < sVar9);
    (result->m_data)._M_elems[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar45[0] - (0xff < sVar10);
    (result->m_data)._M_elems[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar45[2] - (0xff < sVar11);
    (result->m_data)._M_elems[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar45[4] - (0xff < sVar12);
    (result->m_data)._M_elems[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar45[6] - (0xff < sVar13);
    (result->m_data)._M_elems[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar45[8] - (0xff < sVar14);
    (result->m_data)._M_elems[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar45[10] - (0xff < sVar15)
    ;
    (result->m_data)._M_elems[0xe] =
         (0 < sVar16) * (sVar16 < 0x100) * auVar45[0xc] - (0xff < sVar16);
    (result->m_data)._M_elems[0xf] =
         (0 < sVar17) * (sVar17 < 0x100) * auVar45[0xe] - (0xff < sVar17);
    *(uint *)((result->m_data)._M_elems + 0x10) =
         (uint)local_228.state._16_4_ >> 0x18 | (local_228.state._16_4_ & 0xff0000) >> 8 |
         (local_228.state._16_4_ & 0xff00) << 8 | local_228.state._16_4_ << 0x18;
    break;
  case Sha224:
    pSVar37 = &local_228;
    for (lVar38 = 0x1d; lVar38 != 0; lVar38 = lVar38 + -1) {
      *(undefined4 *)pSVar37 = *(undefined4 *)this;
      this = this + 4;
      pSVar37 = (SHA3Context *)((long)pSVar37 + 4);
    }
    iVar35 = 0x1c;
    goto LAB_003563ac;
  case Sha256:
    pSVar37 = &local_228;
    for (lVar38 = 0x1d; lVar38 != 0; lVar38 = lVar38 + -1) {
      *(undefined4 *)pSVar37 = *(undefined4 *)this;
      this = this + 4;
      pSVar37 = (SHA3Context *)((long)pSVar37 + 4);
    }
    iVar35 = 0x20;
LAB_003563ac:
    SHA224_256ResultN((SHA256Context *)&local_228,(uint8_t *)result,iVar35);
    break;
  case Sha384:
    memcpy(&local_228,this,0xe0);
    iVar35 = 0x30;
    goto LAB_0035654f;
  case Sha512:
    memcpy(&local_228,this,0xe0);
    iVar35 = 0x40;
LAB_0035654f:
    SHA384_512ResultN((SHA512Context *)&local_228,(uint8_t *)result,iVar35);
    break;
  case Keccak_224:
  case Keccak_256:
  case Keccak_384:
  case Keccak_512:
    memcpy(&local_228,this,0x1a0);
    sha3Variant = Keccak;
    goto LAB_0035610d;
  case RealSha3_224:
  case RealSha3_256:
  case RealSha3_384:
  case RealSha3_512:
    memcpy(&local_228,this,0x1a0);
    sha3Variant = Sha3;
LAB_0035610d:
    sha3Finish(&local_228,result,sha3Variant);
    break;
  case Blake2b_160:
  case Blake2b_256:
  case Blake2b_384:
  case Blake2b_512:
    uVar34 = hashLengthInternal(method);
    memcpy(&local_228,this,0xf8);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    if (((ulong)local_228.dataQueue._32_8_ <= (ulong)uVar34) && (local_228.state._80_8_ == 0)) {
      bVar42 = CARRY8(local_228.state._64_8_,local_228.dataQueue._24_8_);
      local_228.state._64_8_ = local_228.state._64_8_ + local_228.dataQueue._24_8_;
      local_228.state._72_8_ = local_228.state._72_8_ + (ulong)bVar42;
      if (local_228.dataQueue[0x28] != '\0') {
        local_228.state[0x58] = 0xff;
        local_228.state[0x59] = 0xff;
        local_228.state[0x5a] = 0xff;
        local_228.state[0x5b] = 0xff;
        local_228.state[0x5c] = 0xff;
        local_228.state[0x5d] = 0xff;
        local_228.state[0x5e] = 0xff;
        local_228.state[0x5f] = 0xff;
      }
      local_228.state[0x50] = 0xff;
      local_228.state[0x51] = 0xff;
      local_228.state[0x52] = 0xff;
      local_228.state[0x53] = 0xff;
      local_228.state[0x54] = 0xff;
      local_228.state[0x55] = 0xff;
      local_228.state[0x56] = 0xff;
      local_228.state[0x57] = 0xff;
      lVar38 = 0;
      memset(local_228.state + local_228.dataQueue._24_8_ + 0x60,0,0x80 - local_228.dataQueue._24_8_
            );
      blake2b_compress((blake2b_state *)&local_228,local_228.state + 0x60);
      do {
        *(undefined8 *)(local_78 + lVar38 * 8) = *(undefined8 *)(local_228.state + lVar38 * 8);
        lVar38 = lVar38 + 1;
      } while (lVar38 != 8);
      memcpy(result,local_78,local_228.dataQueue._32_8_);
      memset(local_78,0,0x40);
    }
    break;
  case Blake2s_128:
  case Blake2s_160:
  case Blake2s_224:
  case Blake2s_256:
    uVar34 = hashLengthInternal(method);
    memcpy(&local_228,this,0x88);
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    if (((ulong)local_228.state._120_8_ <= (ulong)uVar34) && (local_228.state._40_4_ == 0)) {
      bVar42 = CARRY4(local_228.state._32_4_,local_228.state._112_4_);
      local_228.state._32_4_ = local_228.state._32_4_ + local_228.state._112_4_;
      local_228.state._36_4_ = local_228.state._36_4_ + (uint)bVar42;
      if (local_228.state[0x80] != '\0') {
        local_228.state[0x2c] = 0xff;
        local_228.state[0x2d] = 0xff;
        local_228.state[0x2e] = 0xff;
        local_228.state[0x2f] = 0xff;
      }
      local_228.state[0x28] = 0xff;
      local_228.state[0x29] = 0xff;
      local_228.state[0x2a] = 0xff;
      local_228.state[0x2b] = 0xff;
      lVar38 = 0;
      memset(local_228.state + local_228.state._112_8_ + 0x30,0,0x40 - local_228.state._112_8_);
      blake2s_compress((blake2s_state *)&local_228,local_228.state + 0x30);
      do {
        *(undefined4 *)(local_78 + lVar38 * 4) = *(undefined4 *)(local_228.state + lVar38 * 4);
        lVar38 = lVar38 + 1;
      } while (lVar38 != 8);
      memcpy(result,local_78,(ulong)uVar34);
      memset(local_78,0,0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCryptographicHashPrivate::State::finalizeUnchecked(QCryptographicHash::Algorithm method,
                                                         HashResult &result) noexcept
{
    switch (method) {
    case QCryptographicHash::Sha1: {
        Sha1State copy = sha1Context;
        sha1FinalizeState(&copy);
        sha1ToHash(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md4: {
        md4_context copy = md4Context;
        md4_final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md5: {
        MD5Context copy = md5Context;
        MD5Final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha224: {
        SHA224Context copy = sha224Context;
        SHA224Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha256: {
        SHA256Context copy = sha256Context;
        SHA256Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha384: {
        SHA384Context copy = sha384Context;
        SHA384Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha512: {
        SHA512Context copy = sha512Context;
        SHA512Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::RealSha3_224:
    case QCryptographicHash::RealSha3_256:
    case QCryptographicHash::RealSha3_384:
    case QCryptographicHash::RealSha3_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Sha3);
        break;
    }
    case QCryptographicHash::Keccak_224:
    case QCryptographicHash::Keccak_256:
    case QCryptographicHash::Keccak_384:
    case QCryptographicHash::Keccak_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Keccak);
        break;
    }
    case QCryptographicHash::Blake2b_160:
    case QCryptographicHash::Blake2b_256:
    case QCryptographicHash::Blake2b_384:
    case QCryptographicHash::Blake2b_512: {
        const auto length = hashLengthInternal(method);
        blake2b_state copy = blake2bContext;
        blake2b_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::Blake2s_128:
    case QCryptographicHash::Blake2s_160:
    case QCryptographicHash::Blake2s_224:
    case QCryptographicHash::Blake2s_256: {
        const auto length = hashLengthInternal(method);
        blake2s_state copy = blake2sContext;
        blake2s_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::NumAlgorithms:
        Q_UNREACHABLE();
    }
}